

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

Rune * re2::Regexp::LeadingString(Regexp *re,int *nrune,ParseFlags *flags)

{
  bool bVar1;
  RegexpOp RVar2;
  int iVar3;
  Regexp **ppRVar4;
  ParseFlags *flags_local;
  int *nrune_local;
  Regexp *re_local;
  
  nrune_local = (int *)re;
  while( true ) {
    RVar2 = op((Regexp *)nrune_local);
    bVar1 = false;
    if (RVar2 == kRegexpConcat) {
      iVar3 = nsub((Regexp *)nrune_local);
      bVar1 = 0 < iVar3;
    }
    if (!bVar1) break;
    ppRVar4 = sub((Regexp *)nrune_local);
    nrune_local = (int *)*ppRVar4;
  }
  *flags = *(ushort *)((long)nrune_local + 2) & FoldCase;
  RVar2 = op((Regexp *)nrune_local);
  if (RVar2 == kRegexpLiteral) {
    *nrune = 1;
    re_local = (Regexp *)(nrune_local + 6);
  }
  else {
    RVar2 = op((Regexp *)nrune_local);
    if (RVar2 == kRegexpLiteralString) {
      *nrune = nrune_local[6];
      re_local = *(Regexp **)(nrune_local + 8);
    }
    else {
      *nrune = 0;
      re_local = (Regexp *)0x0;
    }
  }
  return (Rune *)re_local;
}

Assistant:

Rune* Regexp::LeadingString(Regexp* re, int *nrune,
                            Regexp::ParseFlags *flags) {
  while (re->op() == kRegexpConcat && re->nsub() > 0)
    re = re->sub()[0];

  *flags = static_cast<Regexp::ParseFlags>(re->parse_flags_ & Regexp::FoldCase);

  if (re->op() == kRegexpLiteral) {
    *nrune = 1;
    return &re->rune_;
  }

  if (re->op() == kRegexpLiteralString) {
    *nrune = re->nrunes_;
    return re->runes_;
  }

  *nrune = 0;
  return NULL;
}